

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopPeeling::GetIteratingExitValues(LoopPeeling *this)

{
  CFG *this_00;
  BasicBlock *pBVar1;
  uint uVar2;
  char cVar3;
  uint32_t uVar4;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var6;
  IRContext *pIVar7;
  IRContext *pIVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  bool bVar11;
  uint32_t condition_block_id;
  uint local_7c;
  LoopPeeling **local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  Instruction *local_58;
  LoopPeeling *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  pIVar7 = this->context_;
  if ((pIVar7->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar7);
  }
  this_00 = (pIVar7->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  local_48 = 0;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
             ::_M_manager;
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar9 = (this->loop_->loop_header_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_78 = &local_50;
  local_50 = this;
  if ((pIVar9 == (Instruction *)0x0) ||
     ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_00247eb3:
    (*local_68)(&local_78,&local_78,3);
  }
  else {
    do {
      if (pIVar9 == (Instruction *)0x0) break;
      pIVar10 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar10 = (Instruction *)0x0;
      }
      if (pIVar9->opcode_ != OpPhi) break;
      local_58 = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0024819c;
      cVar3 = (*local_60)(&local_78);
      pIVar9 = pIVar10;
    } while (cVar3 != '\0');
    if (local_68 != (code *)0x0) goto LAB_00247eb3;
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  pBVar1 = this->loop_->loop_merge_;
  if (pBVar1 == (BasicBlock *)0x0) {
    return;
  }
  pIVar9 = (pBVar1->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pvVar5 = CFG::preds(this_00,uVar4);
  if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return;
  }
  pIVar7 = this->context_;
  if ((pIVar7->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar7);
  }
  pIVar7 = (IRContext *)
           (pIVar7->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar9 = (this->loop_->loop_merge_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  blk_id = 0;
  uVar4 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pvVar5 = CFG::preds(this_00,uVar4);
  local_7c = *(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pIVar9 = (this->loop_->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar9->has_result_id_ == true) {
    blk_id = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pvVar5 = CFG::preds(this_00,blk_id);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    ((pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish,&local_7c);
  uVar2 = local_7c;
  bVar11 = _Var6._M_current ==
           (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this->do_while_form_ = !bVar11;
  if (bVar11) {
    pIVar7 = (IRContext *)
             IRContext::GetDominatorAnalysis(this->context_,(this->loop_utils_).function_);
    pIVar8 = (IRContext *)CFG::block(this_00,local_7c);
    pBVar1 = this->loop_->loop_header_;
    local_48 = 0;
    local_50 = (LoopPeeling *)operator_new(0x18);
    local_50->context_ = pIVar7;
    (local_50->loop_utils_).context_ = pIVar8;
    (local_50->loop_utils_).loop_desc_ = (LoopDescriptor *)this;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
               ::_M_manager;
    local_70 = 0;
    local_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_manager;
    pIVar9 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_78 = &local_50;
    if ((pIVar9 != (Instruction *)0x0) &&
       ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      do {
        if (pIVar9 == (Instruction *)0x0) break;
        pIVar10 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar10 = (Instruction *)0x0;
        }
        if (pIVar9->opcode_ != OpPhi) break;
        local_58 = pIVar9;
        if (local_68 == (code *)0x0) goto LAB_0024819c;
        cVar3 = (*local_60)(&local_78,&local_58);
        pIVar9 = pIVar10;
      } while (cVar3 != '\0');
      goto LAB_0024815b;
    }
  }
  else {
    pBVar1 = this->loop_->loop_header_;
    local_48 = 0;
    local_50 = (LoopPeeling *)operator_new(0x18);
    *(uint *)&local_50->context_ = uVar2;
    (local_50->loop_utils_).context_ = pIVar7;
    (local_50->loop_utils_).loop_desc_ = (LoopDescriptor *)this;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
               ::_M_manager;
    local_70 = 0;
    local_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_manager;
    pIVar9 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_78 = &local_50;
    if ((pIVar9 != (Instruction *)0x0) &&
       ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      do {
        if (pIVar9 == (Instruction *)0x0) break;
        pIVar10 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar10 = (Instruction *)0x0;
        }
        if (pIVar9->opcode_ != OpPhi) break;
        local_58 = pIVar9;
        if (local_68 == (code *)0x0) {
LAB_0024819c:
          std::__throw_bad_function_call();
        }
        cVar3 = (*local_60)(&local_78,&local_58);
        pIVar9 = pIVar10;
      } while (cVar3 != '\0');
LAB_0024815b:
      if (local_68 == (code *)0x0) goto LAB_00248174;
    }
  }
  (*local_68)(&local_78,&local_78,3);
LAB_00248174:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

void LoopPeeling::GetIteratingExitValues() {
  CFG& cfg = *context_->cfg();

  loop_->GetHeaderBlock()->ForEachPhiInst(
      [this](Instruction* phi) { exit_value_[phi->result_id()] = nullptr; });

  if (!loop_->GetMergeBlock()) {
    return;
  }
  if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
    return;
  }
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

  auto& header_pred = cfg.preds(loop_->GetHeaderBlock()->id());
  do_while_form_ = std::find(header_pred.begin(), header_pred.end(),
                             condition_block_id) != header_pred.end();
  if (do_while_form_) {
    loop_->GetHeaderBlock()->ForEachPhiInst(
        [condition_block_id, def_use_mgr, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            if (condition_block_id == phi->GetSingleWordInOperand(i + 1)) {
              exit_value_[phi->result_id()] =
                  def_use_mgr->GetDef(phi->GetSingleWordInOperand(i));
            }
          }
        });
  } else {
    DominatorTree* dom_tree =
        &context_->GetDominatorAnalysis(loop_utils_.GetFunction())
             ->GetDomTree();
    BasicBlock* condition_block = cfg.block(condition_block_id);

    loop_->GetHeaderBlock()->ForEachPhiInst(
        [dom_tree, condition_block, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          // Not the back-edge value, check if the phi instruction is the only
          // possible candidate.
          GetIteratorUpdateOperations(loop_, phi, &operations);

          for (Instruction* insn : operations) {
            if (insn == phi) {
              continue;
            }
            if (dom_tree->Dominates(context_->get_instr_block(insn),
                                    condition_block)) {
              return;
            }
          }
          exit_value_[phi->result_id()] = phi;
        });
  }
}